

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BestLiteralSelector.hpp
# Opt level: O0

void __thiscall
Kernel::
CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
::doSelection(CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
              *this,Clause *c,uint eligible)

{
  TermList t;
  TermList t_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint n;
  Term *this_00;
  Literal **ppLVar4;
  List<Kernel::Literal_*> *pLVar5;
  int in_EDX;
  Clause *in_RSI;
  uint besti_1;
  uint i;
  LiteralList *mit_1;
  uint selCnt_1;
  Set<Kernel::Literal_*,_Lib::DefaultHash> maxSet;
  LiteralList *mit;
  uint selCnt;
  LiteralList *nextMax;
  uint besti;
  bool allSelected;
  TermList h1;
  TermList h0;
  TermList t1;
  TermList t0;
  Literal *lit;
  Iterator maxIt;
  Literal *singleSelected;
  LiteralList *maximals;
  undefined4 in_stack_fffffffffffffe58;
  uint in_stack_fffffffffffffe5c;
  Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
  *in_stack_fffffffffffffe60;
  Literal *in_stack_fffffffffffffe68;
  uint eligible_00;
  Clause *in_stack_fffffffffffffe70;
  Set<Kernel::Literal_*,_Lib::DefaultHash> *in_stack_fffffffffffffe78;
  DArray<Kernel::Literal_*> *this_01;
  int local_164;
  Literal *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  List<Kernel::Literal_*> *local_128;
  int local_11c;
  List<Kernel::Literal_*> *local_118;
  uint local_110;
  TermList local_100;
  Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
  *in_stack_ffffffffffffff08;
  TermList in_stack_ffffffffffffff10;
  Iterator local_d0;
  Literal *local_c8;
  List<Kernel::Literal_*> *local_c0;
  int local_14;
  Clause *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  if ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
       ::doSelection(Kernel::Clause*,unsigned_int)::combSup == '\0') &&
     (iVar3 = __cxa_guard_acquire(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
                                   ::doSelection(Kernel::Clause*,unsigned_int)::combSup), iVar3 != 0
     )) {
    doSelection::combSup = Shell::Options::combinatorySup(Lib::env);
    __cxa_guard_release(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
                         ::doSelection(Kernel::Clause*,unsigned_int)::combSup);
  }
  if ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
       ::doSelection(Kernel::Clause*,unsigned_int)::litArr == '\0') &&
     (iVar3 = __cxa_guard_acquire(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
                                   ::doSelection(Kernel::Clause*,unsigned_int)::litArr), iVar3 != 0)
     ) {
    Lib::DArray<Kernel::Literal_*>::DArray
              ((DArray<Kernel::Literal_*> *)in_stack_fffffffffffffe70,
               (size_t)in_stack_fffffffffffffe68);
    __cxa_atexit(Lib::DArray<Kernel::Literal_*>::~DArray,&doSelection::litArr,&__dso_handle);
    __cxa_guard_release(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
                         ::doSelection(Kernel::Clause*,unsigned_int)::litArr);
  }
  if ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
       ::doSelection(Kernel::Clause*,unsigned_int)::maxTermHeads == '\0') &&
     (iVar3 = __cxa_guard_acquire(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
                                   ::doSelection(Kernel::Clause*,unsigned_int)::maxTermHeads),
     iVar3 != 0)) {
    Lib::Set<unsigned_int,_Lib::DefaultHash>::Set((Set<unsigned_int,_Lib::DefaultHash> *)0x89a121);
    __cxa_atexit(Lib::Set<unsigned_int,_Lib::DefaultHash>::~Set,&doSelection::maxTermHeads,
                 &__dso_handle);
    __cxa_guard_release(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
                         ::doSelection(Kernel::Clause*,unsigned_int)::maxTermHeads);
  }
  Lib::Set<unsigned_int,_Lib::DefaultHash>::reset(&doSelection::maxTermHeads);
  this_01 = &doSelection::litArr;
  Lib::DArray<Kernel::Literal_*>::initFromArray<Kernel::Clause>
            ((DArray<Kernel::Literal_*> *)in_stack_fffffffffffffe70,
             (size_t)in_stack_fffffffffffffe68,(Clause *)in_stack_fffffffffffffe60);
  LiteralComparators::
  Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
  ::Composite(in_stack_fffffffffffffe60,
              (Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  Lib::DArray<Kernel::Literal*>::
  sortInversed<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
            ((DArray<Kernel::Literal_*> *)in_stack_ffffffffffffff10._content,
             in_stack_ffffffffffffff08);
  LiteralComparators::
  Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
  ::~Composite(in_stack_fffffffffffffe60);
  local_c0 = (List<Kernel::Literal_*> *)0x0;
  local_c8 = (Literal *)0x0;
  if ((doSelection::combSup & 1U) != 0) {
    fillMaximals((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                  *)this_01,(LiteralList **)in_stack_fffffffffffffe78,
                 (DArray<Kernel::Literal_*> *)in_stack_fffffffffffffe70);
    Lib::List<Kernel::Literal_*>::Iterator::Iterator(&local_d0,local_c0);
    while (bVar1 = Lib::List<Kernel::Literal_*>::Iterator::hasNext((Iterator *)0x89a210), bVar1) {
      this_00 = &Lib::List<Kernel::Literal_*>::Iterator::next((Iterator *)in_stack_fffffffffffffe60)
                 ->super_Term;
      Term::nthArgument(this_00,0);
      Term::nthArgument(this_00,1);
      t._content._4_4_ = in_stack_fffffffffffffe5c;
      t._content._0_4_ = in_stack_fffffffffffffe58;
      ApplicativeHelper::getHead(t);
      t_00._content._4_4_ = in_stack_fffffffffffffe5c;
      t_00._content._0_4_ = in_stack_fffffffffffffe58;
      local_100 = ApplicativeHelper::getHead(t_00);
      bVar1 = TermList::isVar((TermList *)in_stack_fffffffffffffe60);
      if (bVar1) {
        TermList::var((TermList *)&stack0xffffffffffffff10);
        Lib::Set<unsigned_int,_Lib::DefaultHash>::insert
                  ((Set<unsigned_int,_Lib::DefaultHash> *)in_stack_fffffffffffffe60,
                   in_stack_fffffffffffffe5c);
      }
      bVar1 = TermList::isVar((TermList *)in_stack_fffffffffffffe60);
      if (bVar1) {
        TermList::var(&local_100);
        Lib::Set<unsigned_int,_Lib::DefaultHash>::insert
                  ((Set<unsigned_int,_Lib::DefaultHash> *)in_stack_fffffffffffffe60,
                   in_stack_fffffffffffffe5c);
      }
    }
  }
  bVar1 = false;
  Lib::DArray<Kernel::Literal_*>::operator[](&doSelection::litArr,0);
  bVar2 = LiteralSelector::isNegativeForSelection
                    ((LiteralSelector *)in_stack_fffffffffffffe60,
                     (Literal *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  if (bVar2) {
    ppLVar4 = Lib::DArray<Kernel::Literal_*>::operator[](&doSelection::litArr,0);
    local_c8 = *ppLVar4;
  }
  else {
    if ((doSelection::combSup & 1U) == 0) {
      fillMaximals((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                    *)this_01,(LiteralList **)in_stack_fffffffffffffe78,
                   (DArray<Kernel::Literal_*> *)in_stack_fffffffffffffe70);
    }
    local_110 = 0;
    local_118 = local_c0;
    do {
      in_stack_fffffffffffffe78 =
           (Set<Kernel::Literal_*,_Lib::DefaultHash> *)Lib::List<Kernel::Literal_*>::head(local_118)
      ;
      ppLVar4 = Lib::DArray<Kernel::Literal_*>::operator[](&doSelection::litArr,(ulong)local_110);
      if ((in_stack_fffffffffffffe78 == (Set<Kernel::Literal_*,_Lib::DefaultHash> *)*ppLVar4) &&
         (local_118 = Lib::List<Kernel::Literal_*>::tail(local_118),
         local_118 == (List<Kernel::Literal_*> *)0x0)) goto LAB_0089a4c9;
      local_110 = local_110 + 1;
      Lib::DArray<Kernel::Literal_*>::operator[](&doSelection::litArr,(ulong)local_110);
      bVar2 = LiteralSelector::isNegativeForSelection
                        ((LiteralSelector *)in_stack_fffffffffffffe60,
                         (Literal *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    } while (!bVar2);
    ppLVar4 = Lib::DArray<Kernel::Literal_*>::operator[](&doSelection::litArr,(ulong)local_110);
    local_c8 = *ppLVar4;
  }
LAB_0089a4c9:
  if ((local_c8 == (Literal *)0x0) &&
     (pLVar5 = Lib::List<Kernel::Literal_*>::tail(local_c0),
     pLVar5 == (List<Kernel::Literal_*> *)0x0)) {
    local_c8 = Lib::List<Kernel::Literal_*>::head(local_c0);
  }
  if (local_c8 == (Literal *)0x0) {
    local_11c = 0;
    for (local_128 = local_c0; local_128 != (List<Kernel::Literal_*> *)0x0;
        local_128 = Lib::List<Kernel::Literal_*>::tail(local_128)) {
      local_11c = local_11c + 1;
    }
    bVar1 = local_11c == local_14;
  }
  if (bVar1) {
    Clause::setSelected((Clause *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    eligible_00 = (uint)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  }
  else if (local_c8 == (Literal *)0x0) {
    if ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
         ::doSelection(Kernel::Clause*,unsigned_int)::replaced == '\0') &&
       (iVar3 = __cxa_guard_acquire(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
                                     ::doSelection(Kernel::Clause*,unsigned_int)::replaced),
       iVar3 != 0)) {
      Lib::Stack<Kernel::Literal_*>::Stack
                ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe70,
                 (size_t)in_stack_fffffffffffffe68);
      __cxa_atexit(Lib::Stack<Kernel::Literal_*>::~Stack,&doSelection::replaced,&__dso_handle);
      __cxa_guard_release(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
                           ::doSelection(Kernel::Clause*,unsigned_int)::replaced);
    }
    Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::Set
              ((Set<Kernel::Literal_*,_Lib::DefaultHash> *)0x89a5fe);
    local_164 = 0;
    for (pLVar5 = local_c0; pLVar5 != (List<Kernel::Literal_*> *)0x0;
        pLVar5 = Lib::List<Kernel::Literal_*>::tail(pLVar5)) {
      Lib::List<Kernel::Literal_*>::head(pLVar5);
      Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::insert
                ((Set<Kernel::Literal_*,_Lib::DefaultHash> *)in_stack_fffffffffffffe70,
                 in_stack_fffffffffffffe68);
    }
    while (local_c0 != (List<Kernel::Literal_*> *)0x0) {
      Clause::operator[](local_10,local_164);
      bVar1 = Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::contains
                        (in_stack_fffffffffffffe78,(Literal *)in_stack_fffffffffffffe70);
      if (!bVar1) {
        Clause::operator[](local_10,local_164);
        Lib::Stack<Kernel::Literal_*>::push
                  ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe60,
                   (Literal *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      }
      in_stack_fffffffffffffe70 =
           (Clause *)
           Lib::List<Kernel::Literal_*>::pop((List<Kernel::Literal_*> **)in_stack_fffffffffffffe70);
      ppLVar4 = Clause::operator[](local_10,local_164);
      *ppLVar4 = (Literal *)in_stack_fffffffffffffe70;
      local_164 = local_164 + 1;
    }
    while( true ) {
      eligible_00 = (uint)((ulong)in_stack_fffffffffffffe68 >> 0x20);
      bVar1 = Lib::Stack<Kernel::Literal_*>::isNonEmpty(&doSelection::replaced);
      if (!bVar1) break;
      while( true ) {
        Clause::operator[](local_10,local_164);
        bVar1 = Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::contains
                          (in_stack_fffffffffffffe78,(Literal *)in_stack_fffffffffffffe70);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        local_164 = local_164 + 1;
      }
      in_stack_fffffffffffffe68 = Lib::Stack<Kernel::Literal_*>::pop(&doSelection::replaced);
      ppLVar4 = Clause::operator[](local_10,local_164);
      *ppLVar4 = in_stack_fffffffffffffe68;
      local_164 = local_164 + 1;
    }
    Clause::setSelected((Clause *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::~Set
              ((Set<Kernel::Literal_*,_Lib::DefaultHash> *)in_stack_fffffffffffffe60);
  }
  else {
    n = Clause::getLiteralPosition
                  ((Clause *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   in_stack_fffffffffffffea0);
    eligible_00 = (uint)((ulong)in_stack_fffffffffffffe68 >> 0x20);
    if (n != 0) {
      in_stack_fffffffffffffe60 =
           (Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
            *)Clause::operator[](local_10,0);
      ppLVar4 = Clause::operator[](local_10,n);
      std::swap<Kernel::Literal*>((Literal **)in_stack_fffffffffffffe60,ppLVar4);
    }
    Clause::setSelected((Clause *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
  }
  Lib::List<Kernel::Literal_*>::destroy((List<Kernel::Literal_*> *)in_stack_fffffffffffffe70);
  LiteralSelector::ensureSomeColoredSelected(in_stack_fffffffffffffe70,eligible_00);
  return;
}

Assistant:

void doSelection(Clause* c, unsigned eligible) override
  {
    ASS_G(eligible, 1); //trivial cases should be taken care of by the base LiteralSelector

    static bool combSup = env.options->combinatorySup();

    static DArray<Literal*> litArr(64);
    static Set<unsigned> maxTermHeads;
    maxTermHeads.reset();
    litArr.initFromArray(eligible,*c);
    litArr.sortInversed(_comp);

    LiteralList* maximals=0;
    Literal* singleSelected=0; //If equals to 0 in the end, all maximal

    if(combSup){ 
      fillMaximals(maximals, litArr); 
      LiteralList::Iterator maxIt(maximals);
      while(maxIt.hasNext()){
        Literal* lit = maxIt.next();
        TermList t0 = *lit->nthArgument(0);
        TermList t1 = *lit->nthArgument(1);
        TermList h0 = ApplicativeHelper::getHead(t0);  
        TermList h1 = ApplicativeHelper::getHead(t1);
        if(h0.isVar()){ maxTermHeads.insert(h0.var()); }
        if(h1.isVar()){ maxTermHeads.insert(h1.var()); }
      }
    }
    //literals will be selected.
    bool allSelected=false;

    if(isNegativeForSelection(litArr[0])) {
      singleSelected=litArr[0];
    } else {
      if(!combSup){ fillMaximals(maximals, litArr); }
      unsigned besti=0;
      LiteralList* nextMax=maximals;
      while(true) {
        if(nextMax->head()==litArr[besti]) {
          nextMax=nextMax->tail();
          if(nextMax==0) {
            break;
          }
        }
        besti++;
        ASS_L(besti,eligible);
        if(isNegativeForSelection(litArr[besti])){
          singleSelected=litArr[besti];
          break;
        }
      }
    }
    if(!singleSelected && !maximals->tail()) {
      //there is only one maximal literal
      singleSelected=maximals->head();
    }
    if(!singleSelected) {
      unsigned selCnt=0;
      for(LiteralList* mit=maximals; mit; mit=mit->tail()) {
        ASS(isPositiveForSelection(mit->head()));
        selCnt++;
      }
      if(selCnt==eligible) {
        allSelected=true;
      }
    }
    if(allSelected) {
      c->setSelected(eligible);
    } else if(!singleSelected) {
      //select multiple maximal literals
      static Stack<Literal*> replaced(16);
      Set<Literal*> maxSet;
      unsigned selCnt=0;

      for(LiteralList* mit=maximals; mit; mit=mit->tail()) {
        maxSet.insert(mit->head());
      }

      while(maximals) {
        if(!maxSet.contains((*c)[selCnt])) {
          replaced.push((*c)[selCnt]);
        }
        (*c)[selCnt]=LiteralList::pop(maximals);
        selCnt++;
      }
      ASS_G(selCnt,1);
      ASS_LE(selCnt,eligible);

      //put back non-selected literals that were removed
      unsigned i=selCnt;
      while(replaced.isNonEmpty()) {
        while(!maxSet.contains((*c)[i])) {
          i++;
          ASS_L(i,eligible);
        }
        (*c)[i++]=replaced.pop();
      }

      c->setSelected(selCnt);
    } else {
      unsigned besti=c->getLiteralPosition(singleSelected);
      if(besti!=0) {
        std::swap((*c)[0],(*c)[besti]);
      }
      c->setSelected(1);
    }
    LiteralList::destroy(maximals);

    ensureSomeColoredSelected(c, eligible);
  }